

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_geom.c
# Opt level: O3

REF_STATUS ref_geom_pack(REF_GEOM ref_geom,REF_INT *o2n)

{
  REF_DBL *pRVar1;
  REF_DBL *pRVar2;
  REF_INT *pRVar3;
  REF_DBL RVar4;
  int iVar5;
  uint uVar6;
  REF_INT RVar7;
  long lVar8;
  undefined8 uVar9;
  REF_STATUS RVar10;
  ulong uVar11;
  int *piVar12;
  REF_INT *pRVar13;
  int iVar14;
  char *pcVar15;
  long lVar16;
  
  iVar14 = ref_geom->max;
  if (iVar14 < 1) {
    iVar5 = 0;
  }
  else {
    pRVar3 = ref_geom->descr;
    lVar8 = 0;
    iVar5 = 0;
    pRVar13 = pRVar3;
    do {
      if (pRVar3[lVar8 * 6] != -1) {
        lVar16 = 0;
        do {
          pRVar3[iVar5 * 6 + lVar16] = pRVar13[lVar16];
          lVar16 = lVar16 + 1;
        } while (lVar16 != 6);
        pRVar3[(long)(iVar5 * 6) + 5] = o2n[pRVar3[lVar8 * 6 + 5]];
        pRVar1 = ref_geom->param + lVar8 * 2;
        RVar4 = pRVar1[1];
        pRVar2 = ref_geom->param + iVar5 * 2;
        *pRVar2 = *pRVar1;
        pRVar2[1] = RVar4;
        iVar5 = iVar5 + 1;
        iVar14 = ref_geom->max;
      }
      lVar8 = lVar8 + 1;
      pRVar13 = pRVar13 + 6;
    } while (lVar8 < iVar14);
  }
  if (iVar5 == ref_geom->n) {
    RVar7 = -1;
    if (iVar5 < iVar14) {
      pRVar3 = ref_geom->descr;
      lVar8 = (long)iVar5;
      piVar12 = pRVar3 + lVar8 * 6 + 1;
      do {
        iVar5 = iVar5 + 1;
        piVar12[-1] = -1;
        lVar8 = lVar8 + 1;
        *piVar12 = iVar5;
        piVar12 = piVar12 + 6;
      } while (lVar8 < ref_geom->max);
      pRVar3[ref_geom->max * 6 + -5] = -1;
      RVar7 = ref_geom->n;
    }
    ref_geom->blank = RVar7;
    uVar6 = ref_adj_free(ref_geom->ref_adj);
    if (uVar6 == 0) {
      uVar6 = ref_adj_create(&ref_geom->ref_adj);
      if (uVar6 == 0) {
        iVar14 = ref_geom->max;
        if (iVar14 < 1) {
          return 0;
        }
        lVar8 = 0;
        lVar16 = 0;
        do {
          if (*(int *)((long)ref_geom->descr + lVar8) != -1) {
            uVar6 = ref_adj_add(ref_geom->ref_adj,*(REF_INT *)((long)ref_geom->descr + lVar8 + 0x14)
                                ,(REF_INT)lVar16);
            if (uVar6 != 0) {
              uVar11 = (ulong)uVar6;
              pcVar15 = "register geom";
              uVar9 = 0xf5;
              goto LAB_0016fc10;
            }
            iVar14 = ref_geom->max;
          }
          lVar16 = lVar16 + 1;
          lVar8 = lVar8 + 0x18;
          if (iVar14 <= lVar16) {
            return 0;
          }
        } while( true );
      }
      uVar11 = (ulong)uVar6;
      pcVar15 = "create ref_adj for ref_geom";
      uVar9 = 0xf1;
    }
    else {
      uVar11 = (ulong)uVar6;
      pcVar15 = "free to prevent leak";
      uVar9 = 0xf0;
    }
LAB_0016fc10:
    RVar10 = (REF_STATUS)uVar11;
    printf("%s: %d: %s: %d %s\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_geom.c",uVar9,
           "ref_geom_pack",uVar11,pcVar15);
  }
  else {
    printf("%s: %d: %s: %s\nexpected %ld was %ld\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_geom.c",0xe5,
           "ref_geom_pack","count mismatch",(long)iVar5,(long)ref_geom->n);
    RVar10 = 1;
  }
  return RVar10;
}

Assistant:

REF_FCN REF_STATUS ref_geom_pack(REF_GEOM ref_geom, REF_INT *o2n) {
  REF_INT geom, compact, i;
  compact = 0;
  each_ref_geom(ref_geom, geom) {
    for (i = 0; i < REF_GEOM_DESCR_SIZE; i++)
      ref_geom_descr(ref_geom, i, compact) = ref_geom_descr(ref_geom, i, geom);
    ref_geom_node(ref_geom, compact) = o2n[ref_geom_node(ref_geom, geom)];
    for (i = 0; i < 2; i++)
      ref_geom_param(ref_geom, i, compact) = ref_geom_param(ref_geom, i, geom);
    compact++;
  }
  REIS(compact, ref_geom_n(ref_geom), "count mismatch");
  if (ref_geom_n(ref_geom) < ref_geom_max(ref_geom)) {
    for (geom = ref_geom_n(ref_geom); geom < ref_geom_max(ref_geom); geom++) {
      ref_geom_type(ref_geom, geom) = REF_EMPTY;
      ref_geom_id(ref_geom, geom) = geom + 1;
    }
    ref_geom_id(ref_geom, ref_geom_max(ref_geom) - 1) = REF_EMPTY;
    ref_geom_blank(ref_geom) = ref_geom_n(ref_geom);
  } else {
    ref_geom_blank(ref_geom) = REF_EMPTY;
  }
  RSS(ref_adj_free(ref_geom->ref_adj), "free to prevent leak");
  RSS(ref_adj_create(&(ref_geom->ref_adj)), "create ref_adj for ref_geom");

  each_ref_geom(ref_geom, geom) {
    RSS(ref_adj_add(ref_geom->ref_adj, ref_geom_node(ref_geom, geom), geom),
        "register geom");
  }

  return REF_SUCCESS;
}